

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

void psocks_pw_check(void *ctx,pollwrapper *pw)

{
  _Bool _Var1;
  __pid_t _Var2;
  int local_1c;
  pid_t pid;
  int status;
  pollwrapper *pw_local;
  void *ctx_local;
  
  if ((-1 < signalpipe[0]) &&
     (_pid = pw, pw_local = (pollwrapper *)ctx, _Var1 = pollwrap_check_fd_rwx(pw,signalpipe[0],1),
     _Var1)) {
    while (_Var2 = waitpid(-1,&local_1c,1), 0 < _Var2) {
      if (_Var2 == subcommand_pid) {
        still_running = false;
      }
    }
  }
  return;
}

Assistant:

static void psocks_pw_check(void *ctx, pollwrapper *pw)
{
    if (signalpipe[0] >= 0 &&
        pollwrap_check_fd_rwx(pw, signalpipe[0], SELECT_R)) {
        while (true) {
            int status;
            pid_t pid = waitpid(-1, &status, WNOHANG);
            if (pid <= 0)
                break;
            if (pid == subcommand_pid)
                still_running = false;
        }
    }
}